

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

size_t __thiscall Catch::StringStreams::add(StringStreams *this)

{
  pointer puVar1;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *in_RAX;
  size_t sVar2;
  unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  puVar1 = (this->m_unused).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((this->m_unused).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start == puVar1) {
    local_18.m_ptr = in_RAX;
    Detail::make_unique<std::__cxx11::ostringstream>();
    std::
    vector<Catch::Detail::unique_ptr<std::__cxx11::ostringstream>,std::allocator<Catch::Detail::unique_ptr<std::__cxx11::ostringstream>>>
    ::emplace_back<Catch::Detail::unique_ptr<std::__cxx11::ostringstream>>
              ((vector<Catch::Detail::unique_ptr<std::__cxx11::ostringstream>,std::allocator<Catch::Detail::unique_ptr<std::__cxx11::ostringstream>>>
                *)this,&local_18);
    if (local_18.m_ptr !=
        (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_18.m_ptr + 8))();
    }
    sVar2 = ((long)(this->m_streams).
                   super__Vector_base<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_streams).
                   super__Vector_base<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) - 1;
  }
  else {
    sVar2 = puVar1[-1];
    (this->m_unused).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1 + -1;
  }
  return sVar2;
}

Assistant:

auto add() -> std::size_t {
            if( m_unused.empty() ) {
                m_streams.push_back( Detail::make_unique<std::ostringstream>() );
                return m_streams.size()-1;
            }
            else {
                auto index = m_unused.back();
                m_unused.pop_back();
                return index;
            }
        }